

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinputsimulator.h
# Opt level: O1

XInputSimulator * XInputSimulator::getInstance(void)

{
  XInputSimulatorImplLinux *this;
  
  if (getInstance()::instance == '\0') {
    getInstance();
  }
  this = (XInputSimulatorImplLinux *)operator_new(0xf0);
  XInputSimulatorImplLinux::XInputSimulatorImplLinux(this);
  getInstance::instance.implementation = (XInputSimulatorImpl *)this;
  return &getInstance::instance;
}

Assistant:

static XInputSimulator & getInstance()
    {
        static XInputSimulator instance;

#ifdef __linux__
        instance.implementation = new XInputSimulatorImplLinux;
#elif __APPLE__
        instance.implementation = new XInputSimulatorImplMacOs;
#elif _WIN32
        instance.implementation = new XInputSimulatorImplWin;
#endif
        return instance;
    }